

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addUnknownChunks(ucvector *out,uchar *data,size_t datasize)

{
  uint uVar1;
  ulong in_RDX;
  uchar *in_RSI;
  size_t *in_RDI;
  uint error;
  uchar *inchunk;
  uint in_stack_ffffffffffffffd0;
  uchar *chunk;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  chunk = in_RSI;
  while( true ) {
    if (in_RDX <= (ulong)((long)in_RSI - (long)chunk)) {
      return 0;
    }
    uVar1 = lodepng_chunk_append
                      ((uchar **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_RDI,chunk);
    if (uVar1 != 0) break;
    in_RDI[2] = in_RDI[1];
    in_RSI = lodepng_chunk_next(in_RSI,(uchar *)(ulong)in_stack_ffffffffffffffd0);
  }
  return uVar1;
}

Assistant:

static unsigned addUnknownChunks(ucvector* out, unsigned char* data, size_t datasize) {
  unsigned char* inchunk = data;
  while((size_t)(inchunk - data) < datasize) {
    CERROR_TRY_RETURN(lodepng_chunk_append(&out->data, &out->size, inchunk));
    out->allocsize = out->size; /*fix the allocsize again*/
    inchunk = lodepng_chunk_next(inchunk, data + datasize);
  }
  return 0;
}